

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O3

bool __thiscall
SQVM::Call(SQVM *this,SQObjectPtr *closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr *outres
          ,SQBool raiseerror)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQObjectPtr *pSVar4;
  SQTable *pSVar5;
  SQTable *pSVar6;
  bool bVar7;
  bool suspend;
  SQObjectPtr temp;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  SVar2 = (closure->super_SQObject)._type;
  if (SVar2 == OT_CLASS) {
    local_50.super_SQObject._type = OT_NULL;
    local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
    local_40.super_SQObject._type = OT_NULL;
    local_40.super_SQObject._unVal.pTable = (SQTable *)0x0;
    CreateClassInstance(this,(closure->super_SQObject)._unVal.pClass,outres,&local_50);
    if ((local_50.super_SQObject._type == OT_NATIVECLOSURE) ||
       (bVar7 = true, local_50.super_SQObject._type == OT_CLOSURE)) {
      pSVar4 = (this->_stack)._vals;
      SVar2 = pSVar4[stackbase].super_SQObject._type;
      pSVar5 = pSVar4[stackbase].super_SQObject._unVal.pTable;
      pSVar6 = (outres->super_SQObject)._unVal.pTable;
      pSVar4[stackbase].super_SQObject._unVal.pTable = pSVar6;
      SVar3 = (outres->super_SQObject)._type;
      pSVar4[stackbase].super_SQObject._type = SVar3;
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
      bVar7 = Call(this,&local_50,nparams,stackbase,&local_40,raiseerror);
    }
    SQObjectPtr::~SQObjectPtr(&local_40);
    SQObjectPtr::~SQObjectPtr(&local_50);
  }
  else if (SVar2 == OT_NATIVECLOSURE) {
    bVar7 = CallNative(this,(closure->super_SQObject)._unVal.pNativeClosure,nparams,stackbase,outres
                       ,(bool *)&local_50);
  }
  else if (SVar2 == OT_CLOSURE) {
    bVar7 = Execute(this,closure,nparams,stackbase,outres,raiseerror,ET_CALL);
  }
  else {
    bVar7 = false;
  }
  return bVar7;
}

Assistant:

bool SQVM::Call(SQObjectPtr &closure,SQInteger nparams,SQInteger stackbase,SQObjectPtr &outres,SQBool raiseerror)
{
#ifdef _DEBUG
SQInteger prevstackbase = _stackbase;
#endif
    switch(type(closure)) {
    case OT_CLOSURE:
        return Execute(closure, nparams, stackbase, outres, raiseerror);
        break;
    case OT_NATIVECLOSURE:{
        bool suspend;
        return CallNative(_nativeclosure(closure), nparams, stackbase, outres,suspend);

                          }
        break;
    case OT_CLASS: {
        SQObjectPtr constr;
        SQObjectPtr temp;
        CreateClassInstance(_class(closure),outres,constr);
        SQObjectType ctype = type(constr);
        if (ctype == OT_NATIVECLOSURE || ctype == OT_CLOSURE) {
            _stack[stackbase] = outres;
            return Call(constr,nparams,stackbase,temp,raiseerror);
        }
        return true;
                   }
        break;
    default:
        return false;
    }
#ifdef _DEBUG
    if(!_suspended) {
        assert(_stackbase == prevstackbase);
    }
#endif
    return true;
}